

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall
btMatrixX<float>::multiplyAdd2_p8r
          (btMatrixX<float> *this,btScalar *B,btScalar *C,int numRows,int numRowsOther,int row,
          int col)

{
  int iVar1;
  btScalar *cc;
  btScalar *pbVar2;
  int iVar3;
  int col_00;
  bool bVar4;
  
  iVar1 = 0;
  if (numRowsOther < 1) {
    numRowsOther = 0;
  }
  if (numRows < 1) {
    numRows = 0;
  }
  for (; iVar1 != numRows; iVar1 = iVar1 + 1) {
    pbVar2 = C;
    col_00 = col;
    iVar3 = numRowsOther;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      addElem(this,iVar1 + row,col_00,
              B[6] * pbVar2[6] +
              B[5] * pbVar2[5] +
              B[4] * pbVar2[4] + B[2] * pbVar2[2] + B[1] * pbVar2[1] + *B * *pbVar2);
      pbVar2 = pbVar2 + 8;
      col_00 = col_00 + 1;
    }
    B = B + 8;
  }
  return;
}

Assistant:

void multiplyAdd2_p8r (const btScalar *B, const btScalar *C,  int numRows,  int numRowsOther ,int row, int col)
	{
		const btScalar *bb = B;
		for ( int i = 0;i<numRows;i++)
		{
			const btScalar *cc = C;
			for ( int j = 0;j<numRowsOther;j++)
			{
				btScalar sum;
				sum  = bb[0]*cc[0];
				sum += bb[1]*cc[1];
				sum += bb[2]*cc[2];
				sum += bb[4]*cc[4];
				sum += bb[5]*cc[5];
				sum += bb[6]*cc[6];
				addElem(row+i,col+j,sum);
				cc += 8;
			}
			bb += 8;
		}
	}